

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# live.cc
# Opt level: O3

void __thiscall pstack::Procman::LiveProcess::stopProcess(LiveProcess *this)

{
  string *__endptr;
  string *psVar1;
  Context *pCVar2;
  _Base_ptr p_Var3;
  DIR *__dirp;
  dirent64 *pdVar4;
  long lVar5;
  ostream *poVar6;
  pair<std::_Rb_tree_iterator<int>,_bool> pVar7;
  undefined1 local_b0 [8];
  set<int,_std::less<int>,_std::allocator<int>_> suspended;
  LiveProcess *local_78;
  string dirName;
  char *p;
  long local_48 [2];
  lwpid_t local_34 [2];
  lwpid_t tid;
  
  suspended._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&suspended;
  suspended._M_t._M_impl._0_4_ = 0;
  suspended._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  suspended._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  suspended._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  suspended._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       suspended._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  stop(this,this->pid);
  suspended._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)&this->pid;
  std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
  _M_insert_unique<int_const&>
            ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)local_b0,
             (int *)suspended._M_t._M_impl.super__Rb_tree_header._M_node_count);
  __endptr = (string *)((long)&dirName.field_2 + 8);
  do {
    p_Var3 = suspended._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
    psVar1 = (string *)(this->super_Process).context;
    dirName.field_2._8_8_ = local_48;
    std::__cxx11::string::_M_construct<char_const*>(__endptr,"task","");
    pstack::Context::procname((int)&local_78,psVar1);
    if ((long *)dirName.field_2._8_8_ != local_48) {
      operator_delete((void *)dirName.field_2._8_8_,local_48[0] + 1);
    }
    __dirp = opendir((char *)local_78);
    if (__dirp != (DIR *)0x0) {
      while( true ) {
        pdVar4 = readdir64(__dirp);
        if (pdVar4 == (dirent64 *)0x0) break;
        lVar5 = strtol(pdVar4->d_name,(char **)__endptr,0);
        local_34[0] = (lwpid_t)lVar5;
        if (*(char *)dirName.field_2._8_8_ == '\0') {
          pVar7 = std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
                  _M_insert_unique<int_const&>
                            ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>
                              *)local_b0,local_34);
          if (((undefined1  [16])pVar7 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            stop(this,local_34[0]);
          }
        }
      }
    }
    closedir(__dirp);
    if ((p_Var3 != suspended._M_t._M_impl.super__Rb_tree_header._M_header._M_right) &&
       ((pCVar2 = (this->super_Process).context, p_Var3 != (_Base_ptr)0x1 ||
        (1 < *(int *)(pCVar2 + 0xa0))))) {
      poVar6 = *(ostream **)(pCVar2 + 0x78);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"found ",6);
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," new LWPs after first ",0x16);
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    }
    if (local_78 != (LiveProcess *)&dirName._M_string_length) {
      operator_delete(local_78,dirName._M_string_length + 1);
    }
  } while (p_Var3 != suspended._M_t._M_impl.super__Rb_tree_header._M_header._M_right);
  local_78 = this;
  td_ta_thr_iter((this->super_Process).agent,
                 threadListCb<pstack::Procman::LiveProcess::stopProcess()::__0>,&local_78,0,
                 0xffffffec,0,0xffffffff);
  pCVar2 = (this->super_Process).context;
  if (1 < *(int *)(pCVar2 + 0xa0)) {
    poVar6 = *(ostream **)(pCVar2 + 0x78);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"stopped process ",0x10);
    poVar6 = (ostream *)
             std::ostream::operator<<
                       (poVar6,*(int *)suspended._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             local_b0);
  return;
}

Assistant:

void
LiveProcess::stopProcess()
{
    // suspend the main process itself first.
    // XXX: Note this can actually fail if the main thread exits before the
    // remaining tasks.  Other things also fail in that case - eg, opening
    // stuff from /proc/pid/fd, etc. Really those operations should use
    // /proc/<pid>/task/<tid> of a task we have suspended, rather than the main
    // process
    std::set<lwpid_t> suspended;
    stop(pid);
    suspended.insert(pid);

    /*
     * Stop all remaining LWPs/kernel tasks. Do this before we stop the
     * threads. Stopping the threads with thread_db actually just returns an
     * error in linux, but stopping everything here ensures that we are not
     * racing the process threads to read the thread list later.
     */
    size_t lastStopCount;
    do {
        lastStopCount = suspended.size();
        std::string dirName = context.procname(pid, "task");
        DIR *d = opendir(dirName.c_str());
        if (d != nullptr) {
            for (dirent *de; (de = readdir(d)) != nullptr; ) {
                char *p;
                lwpid_t tid = strtol(de->d_name, &p, 0);
                if (*p == 0) {
                    auto [_, isnew ] = suspended.insert(tid);
                    if (isnew)
                        stop(tid);
                }
            }
        }
        closedir(d);
        // if we found any threads, log it as debug. If we went around more than once, always log.
        if (lastStopCount != suspended.size() && (context.verbose >= 2 || lastStopCount != 1))
            *context.debug << "found " << suspended.size() - lastStopCount << " new LWPs after first " << lastStopCount << "\n";
    } while (lastStopCount != suspended.size());

    /*
     * Attempt to enumerate the threads and suspend with pthread_db. This will
     * probably just fail, but all the LWPs are suspended now, anyway.
     */
    listThreads([this] (const td_thrhandle_t *thr) {
        td_thrinfo_t info;
        td_thr_get_info(thr, &info);
        int suspendError = td_thr_dbsuspend(thr);
        if (suspendError != 0 && suspendError != TD_NOCAPAB)
            *context.debug << "can't suspend thread "  << thr << ": will suspend it's LWP " << info.ti_lid << "\n";
        });

    if (context.verbose >= 2)
        *context.debug << "stopped process " << pid << "\n";
}